

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_setupvali(lua_State *L,LClosure *cl,TValue *ra,int b)

{
  UpVal *pUVar1;
  Value *pVVar2;
  Value VVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  if (ra->tt_ == 3) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (ra->value_).n;
    auVar5 = vroundsd_avx(auVar5,auVar5,9);
    dVar4 = auVar5._0_8_;
    if (((dVar4 != (ra->value_).n) || (dVar4 < -9.223372036854776e+18)) ||
       (9.223372036854776e+18 <= dVar4)) goto LAB_0014a1bb;
    VVar3.i = (lua_Integer)dVar4;
  }
  else {
    if (ra->tt_ != 0x13) {
LAB_0014a1bb:
      luaG_runerror(L,"upvalue of integer type, cannot be set to non integer value");
    }
    VVar3 = ra->value_;
  }
  pUVar1 = cl->upvals[b];
  pVVar2 = &pUVar1->v->value_;
  *pVVar2 = VVar3;
  *(undefined2 *)(pVVar2 + 1) = 0x13;
  if (((short)ra->tt_ < 0) && (pUVar1->v == (TValue *)&pUVar1->u)) {
    luaC_upvalbarrier_(L,(ra->value_).gc);
    return;
  }
  return;
}

Assistant:

void raviV_op_setupvali(lua_State *L, LClosure *cl, TValue *ra, int b) {
  lua_Integer ia;
  if (tointegerns(ra, &ia)) {
    UpVal *uv = cl->upvals[b];
    setivalue(uv->v, ia);
    luaC_upvalbarrier(L, uv, ra);
  }
  else
    luaG_runerror(
        L, "upvalue of integer type, cannot be set to non integer value");
}